

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
libcellml::Annotator::AnnotatorImpl::addIssueInvalidArgument
          (AnnotatorImpl *this,CellmlElementType type)

{
  IssuePtr issue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  CellmlElementType in_stack_ffffffffffffff7c;
  IssuePtr local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  Issue::IssueImpl::create();
  cellmlElementTypeAsString_abi_cxx11_(in_stack_ffffffffffffff7c);
  std::operator+(&local_50,"The item is internally inconsistent: the enum type \'",&local_70);
  std::operator+(&local_30,&local_50,"\' cannot be used with the stored item.");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  Issue::IssueImpl::setDescription
            ((local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,&local_30);
  Issue::IssueImpl::setReferenceRule
            ((local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,ANNOTATOR_INCONSISTENT_TYPE);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_80);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void Annotator::AnnotatorImpl::addIssueInvalidArgument(CellmlElementType type)
{
    auto issue = Issue::IssueImpl::create();
    auto description = "The item is internally inconsistent: the enum type '" + cellmlElementTypeAsString(type) + "' cannot be used with the stored item.";
    issue->mPimpl->setDescription(description);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANNOTATOR_INCONSISTENT_TYPE);
    addIssue(issue);
}